

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table_visitor.cpp
# Opt level: O1

void __thiscall
symbol_table_visitor::visit(symbol_table_visitor *this,NotExtendedClassDeclaration *ptr)

{
  pointer *pppBVar1;
  BaseScope *pBVar2;
  iterator __position;
  pointer ppDVar3;
  ClassSymbol *this_00;
  mapped_type *ppBVar4;
  BaseScope *value;
  pointer ppDVar5;
  
  assert_not_declared_in_this_scope(this,(ptr->super_Class_declaration).name);
  pBVar2 = this->curr_scope;
  this_00 = (ClassSymbol *)operator_new(0x58);
  ClassSymbol::ClassSymbol(this_00,&ptr->super_Class_declaration);
  this->curr_class = this_00;
  ppBVar4 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BaseSymbol_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BaseSymbol_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BaseSymbol_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BaseSymbol_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pBVar2->symbols,(ptr->super_Class_declaration).name);
  *ppBVar4 = (mapped_type)this_00;
  value = (BaseScope *)operator_new(0xa0);
  memset(value,0,0xa0);
  value->_vptr_BaseScope = (_func_int **)&PTR_frame_start_0013e270;
  value->holder = (Base *)0x0;
  (value->symbols)._M_h._M_buckets = &(value->symbols)._M_h._M_single_bucket;
  (value->symbols)._M_h._M_bucket_count = 1;
  (value->symbols)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (value->symbols)._M_h._M_element_count = 0;
  (value->symbols)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (value->symbols)._M_h._M_rehash_policy._M_next_resize = 0;
  (value->symbols)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (value->children).super__Vector_base<BaseScope_*,_std::allocator<BaseScope_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (value->children).super__Vector_base<BaseScope_*,_std::allocator<BaseScope_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (value->children).super__Vector_base<BaseScope_*,_std::allocator<BaseScope_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  value->parent = (BaseScope *)0x0;
  (value->addresses)._M_h._M_buckets = &(value->addresses)._M_h._M_single_bucket;
  (value->addresses)._M_h._M_bucket_count = 1;
  (value->addresses)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (value->addresses)._M_h._M_element_count = 0;
  (value->addresses)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (value->addresses)._M_h._M_rehash_policy._M_next_resize = 0;
  (value->addresses)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->curr_scope = value;
  Class_declaration::SetScope(&ptr->super_Class_declaration,value);
  this->curr_scope->parent = pBVar2;
  __position._M_current =
       (pBVar2->children).super__Vector_base<BaseScope_*,_std::allocator<BaseScope_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (pBVar2->children).super__Vector_base<BaseScope_*,_std::allocator<BaseScope_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<BaseScope*,std::allocator<BaseScope*>>::_M_realloc_insert<BaseScope*const&>
              ((vector<BaseScope*,std::allocator<BaseScope*>> *)&pBVar2->children,__position,
               &this->curr_scope);
  }
  else {
    *__position._M_current = this->curr_scope;
    pppBVar1 = &(pBVar2->children).super__Vector_base<BaseScope_*,_std::allocator<BaseScope_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  ppDVar3 = (ptr->super_Class_declaration).decls.
            super__Vector_base<Declaration_*,_std::allocator<Declaration_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppDVar5 = (ptr->super_Class_declaration).decls.
                 super__Vector_base<Declaration_*,_std::allocator<Declaration_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppDVar5 != ppDVar3; ppDVar5 = ppDVar5 + 1) {
    (**((*ppDVar5)->super_Base)._vptr_Base)(*ppDVar5,this);
  }
  this->curr_scope = pBVar2;
  this->curr_class = (ClassSymbol *)0x0;
  return;
}

Assistant:

void symbol_table_visitor::visit(NotExtendedClassDeclaration* ptr) {
    assert_not_declared_in_this_scope(ptr->name);
    
    auto old = curr_scope;

    curr_class = new ClassSymbol(ptr);
    old->symbols[*ptr->name] = curr_class;
    curr_scope = new BaseScope();
    ptr->SetScope(curr_scope);
    curr_scope->parent = old;
    old->children.push_back(curr_scope);

    for(auto i : ptr->decls) {
        i->accept(this);
    }

    curr_scope = old;
    curr_class = nullptr;
    //name
}